

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_case21.c
# Opt level: O2

double xbspline(double u,int ider,hyb_gga_xc_case21_params *params)

{
  int i;
  long lVar1;
  double dVar2;
  double temp [5];
  double local_58 [5];
  
  dVar2 = 0.0;
  for (lVar1 = 0; lVar1 < params->Nsp; lVar1 = lVar1 + 1) {
    xc_bspline((int)lVar1,params->k,u,ider,params->knots,local_58);
    dVar2 = dVar2 + params->cx[lVar1] * local_58[(uint)ider];
  }
  return dVar2;
}

Assistant:

GPU_DEVICE_FUNCTION static double xbspline(double u, int ider, const hyb_gga_xc_case21_params * params) {
  assert(ider<=4);

  double result=0.0;
  double temp[5]; /* dimension ider+1 */
  for(int i=0;i<params->Nsp;i++) {
    xc_bspline(i, params->k, u, ider, params->knots, temp);
    result += params->cx[i]*temp[ider];
  }
  //printf("xbspline %i %e = % e\n",ider,u,result);
  return result;
}